

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_formatter-inl.h
# Opt level: O3

populator_set * spdlog::json_formatter::make_default_populators_(void)

{
  pointer *__ptr;
  populator_set *in_RDI;
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  *in_R9;
  _Head_base<0UL,_spdlog::populators::logger_name_populator_*,_false> local_28;
  unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  local_20;
  _Head_base<0UL,_spdlog::populators::date_time_populator_*,_false> local_18;
  long *local_10;
  
  details::make_unique<spdlog::populators::date_time_populator>();
  details::make_unique<spdlog::populators::level_populator>();
  details::make_unique<spdlog::populators::logger_name_populator>();
  details::make_unique<spdlog::populators::message_populator>();
  populators::
  make_populator_set<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::logger_name_populator,std::default_delete<spdlog::populators::logger_name_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
            (in_RDI,(populators *)&local_10,
             (unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
              *)&local_18,&local_20,
             (unique_ptr<spdlog::populators::logger_name_populator,_std::default_delete<spdlog::populators::logger_name_populator>_>
              *)&local_28,in_R9);
  if (local_28._M_head_impl != (logger_name_populator *)0x0) {
    (*((local_28._M_head_impl)->super_pattern_populator).super_populator._vptr_populator[1])();
  }
  if ((tuple<spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
       )local_20._M_t.
        super___uniq_ptr_impl<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
        ._M_t.
        super__Tuple_impl<0UL,_spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
        .super__Head_base<0UL,_spdlog::populators::level_populator_*,_false>._M_head_impl !=
      (_Head_base<0UL,_spdlog::populators::level_populator_*,_false>)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super___uniq_ptr_impl<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spdlog::populators::level_populator_*,_std::default_delete<spdlog::populators::level_populator>_>
                          .super__Head_base<0UL,_spdlog::populators::level_populator_*,_false>.
                          _M_head_impl + 8))();
  }
  if (local_18._M_head_impl != (date_time_populator *)0x0) {
    (*((local_18._M_head_impl)->super_pattern_populator).super_populator._vptr_populator[1])();
  }
  if (local_10 != (long *)0x0) {
    (**(code **)(*local_10 + 8))();
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE populators::populator_set json_formatter::make_default_populators_()
{
    return populators::make_populator_set(
        details::make_unique<populators::date_time_populator>(),
        details::make_unique<populators::level_populator>(),
        details::make_unique<populators::logger_name_populator>(),
        details::make_unique<populators::message_populator>());
}